

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O3

void __thiscall cmFindCommon::SelectDefaultRootPathMode(cmFindCommon *this)

{
  pointer pcVar1;
  int iVar2;
  RootPathMode RVar3;
  string *psVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string rootPathMode;
  string findRootPathVar;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  size_type local_40;
  pointer local_38;
  string local_30;
  
  local_38 = (this->CMakePathName)._M_dataplus._M_p;
  local_40 = (this->CMakePathName)._M_string_length;
  local_50._M_len = 0x1a;
  local_50._M_str = "CMAKE_FIND_ROOT_PATH_MODE_";
  views._M_len = 2;
  views._M_array = &local_50;
  cmCatViews_abi_cxx11_(&local_30,views);
  psVar4 = cmMakefile::GetSafeDefinition(this->Makefile,&local_30);
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  local_50._M_len = (size_t)&local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + psVar4->_M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar2 == 0) {
    RVar3 = RootPathModeNever;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar2 == 0) {
      RVar3 = RootPathModeOnly;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar2 != 0) goto LAB_004b8d77;
      RVar3 = RootPathModeBoth;
    }
  }
  this->FindRootPathMode = RVar3;
LAB_004b8d77:
  if ((size_type *)local_50._M_len != &local_40) {
    operator_delete((void *)local_50._M_len,local_40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmFindCommon::SelectDefaultRootPathMode()
{
  // Check the policy variable for this find command type.
  std::string findRootPathVar =
    cmStrCat("CMAKE_FIND_ROOT_PATH_MODE_", this->CMakePathName);
  std::string rootPathMode =
    this->Makefile->GetSafeDefinition(findRootPathVar);
  if (rootPathMode == "NEVER") {
    this->FindRootPathMode = RootPathModeNever;
  } else if (rootPathMode == "ONLY") {
    this->FindRootPathMode = RootPathModeOnly;
  } else if (rootPathMode == "BOTH") {
    this->FindRootPathMode = RootPathModeBoth;
  }
}